

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall btMultiBodyDynamicsWorld::calculateSimulationIslands(btMultiBodyDynamicsWorld *this)

{
  btSimulationIslandManager *pbVar1;
  btPersistentManifold *pbVar2;
  btCollisionObject *pbVar3;
  btCollisionObject *pbVar4;
  btTypedConstraint *pbVar5;
  btMultiBody *pbVar6;
  btMultiBodyLinkCollider *pbVar7;
  btMultiBodyConstraint *pbVar8;
  int iVar9;
  int iVar10;
  uint q;
  uint uVar11;
  btMultiBodyLinkCollider *pbVar12;
  btMultiBodyLinkCollider *pbVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  CProfileManager::Start_Profile("calculateSimulationIslands");
  pbVar1 = (this->super_btDiscreteDynamicsWorld).m_islandManager;
  (*pbVar1->_vptr_btSimulationIslandManager[2])
            (pbVar1,this,
             (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_dispatcher1);
  iVar9 = (this->super_btDiscreteDynamicsWorld).m_predictiveManifolds.m_size;
  if (0 < iVar9) {
    lVar15 = 0;
    do {
      pbVar2 = (this->super_btDiscreteDynamicsWorld).m_predictiveManifolds.m_data[lVar15];
      pbVar3 = pbVar2->m_body0;
      if ((((pbVar3 != (btCollisionObject *)0x0) &&
           (pbVar4 = pbVar2->m_body1, pbVar4 != (btCollisionObject *)0x0)) &&
          ((pbVar3->m_collisionFlags & 3U) == 0)) && ((pbVar4->m_collisionFlags & 3) == 0)) {
        btUnionFind::unite(&((this->super_btDiscreteDynamicsWorld).m_islandManager)->m_unionFind,
                           pbVar3->m_islandTag1,pbVar4->m_islandTag1);
        iVar9 = (this->super_btDiscreteDynamicsWorld).m_predictiveManifolds.m_size;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar9);
  }
  lVar15 = (long)(this->super_btDiscreteDynamicsWorld).m_constraints.m_size;
  if (0 < lVar15) {
    lVar16 = 0;
    do {
      pbVar5 = (this->super_btDiscreteDynamicsWorld).m_constraints.m_data[lVar16];
      if (((pbVar5->m_isEnabled == true) &&
          (((pbVar5->m_rbA->super_btCollisionObject).m_collisionFlags & 3) == 0)) &&
         (((pbVar5->m_rbB->super_btCollisionObject).m_collisionFlags & 3) == 0)) {
        btUnionFind::unite(&((this->super_btDiscreteDynamicsWorld).m_islandManager)->m_unionFind,
                           (pbVar5->m_rbA->super_btCollisionObject).m_islandTag1,
                           (pbVar5->m_rbB->super_btCollisionObject).m_islandTag1);
      }
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
  }
  iVar9 = (this->m_multiBodies).m_size;
  if (0 < iVar9) {
    lVar15 = 0;
    do {
      pbVar6 = (this->m_multiBodies).m_data[lVar15];
      iVar10 = (pbVar6->m_links).m_size;
      if (0 < iVar10) {
        lVar14 = 0x1e8;
        lVar16 = 0;
        pbVar12 = pbVar6->m_baseCollider;
        do {
          pbVar7 = *(btMultiBodyLinkCollider **)
                    ((long)(((pbVar6->m_links).m_data)->m_inertiaLocal).m_floats + lVar14 + -4);
          pbVar13 = pbVar12;
          if (pbVar7 != (btMultiBodyLinkCollider *)0x0) {
            uVar11 = *(uint *)(pbVar7 + 0xe0) & 3;
            if ((uVar11 == 0) && (pbVar12 != (btMultiBodyLinkCollider *)0x0)) {
              pbVar13 = pbVar7;
              if (((byte)pbVar12[0xe0] & 3) != 0) goto LAB_001c37f3;
              btUnionFind::unite(&((this->super_btDiscreteDynamicsWorld).m_islandManager)->
                                  m_unionFind,*(int *)(pbVar12 + 0xe4),*(int *)(pbVar7 + 0xe4));
              iVar10 = (pbVar6->m_links).m_size;
              uVar11 = *(uint *)(pbVar7 + 0xe0) & 3;
            }
            pbVar13 = pbVar12;
            if (uVar11 == 0) {
              pbVar13 = pbVar7;
            }
          }
LAB_001c37f3:
          lVar16 = lVar16 + 1;
          lVar14 = lVar14 + 600;
          pbVar12 = pbVar13;
        } while (lVar16 < iVar10);
        iVar9 = (this->m_multiBodies).m_size;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar9);
  }
  if (0 < (this->m_multiBodyConstraints).m_size) {
    lVar15 = 0;
    do {
      pbVar8 = (this->m_multiBodyConstraints).m_data[lVar15];
      uVar11 = (*pbVar8->_vptr_btMultiBodyConstraint[3])(pbVar8);
      q = (*pbVar8->_vptr_btMultiBodyConstraint[4])(pbVar8);
      if (-1 < (int)(q | uVar11)) {
        btUnionFind::unite(&((this->super_btDiscreteDynamicsWorld).m_islandManager)->m_unionFind,
                           uVar11,q);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (this->m_multiBodyConstraints).m_size);
  }
  pbVar1 = (this->super_btDiscreteDynamicsWorld).m_islandManager;
  (*pbVar1->_vptr_btSimulationIslandManager[3])(pbVar1,this);
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::calculateSimulationIslands()
{
	BT_PROFILE("calculateSimulationIslands");

	getSimulationIslandManager()->updateActivationState(getCollisionWorld(),getCollisionWorld()->getDispatcher());

    {
        //merge islands based on speculative contact manifolds too
        for (int i=0;i<this->m_predictiveManifolds.size();i++)
        {
            btPersistentManifold* manifold = m_predictiveManifolds[i];
            
            const btCollisionObject* colObj0 = manifold->getBody0();
            const btCollisionObject* colObj1 = manifold->getBody1();
            
            if (((colObj0) && (!(colObj0)->isStaticOrKinematicObject())) &&
                ((colObj1) && (!(colObj1)->isStaticOrKinematicObject())))
            {
				getSimulationIslandManager()->getUnionFind().unite((colObj0)->getIslandTag(),(colObj1)->getIslandTag());
            }
        }
    }
    
	{
		int i;
		int numConstraints = int(m_constraints.size());
		for (i=0;i< numConstraints ; i++ )
		{
			btTypedConstraint* constraint = m_constraints[i];
			if (constraint->isEnabled())
			{
				const btRigidBody* colObj0 = &constraint->getRigidBodyA();
				const btRigidBody* colObj1 = &constraint->getRigidBodyB();

				if (((colObj0) && (!(colObj0)->isStaticOrKinematicObject())) &&
					((colObj1) && (!(colObj1)->isStaticOrKinematicObject())))
				{
					getSimulationIslandManager()->getUnionFind().unite((colObj0)->getIslandTag(),(colObj1)->getIslandTag());
				}
			}
		}
	}

	//merge islands linked by Featherstone link colliders
	for (int i=0;i<m_multiBodies.size();i++)
	{
		btMultiBody* body = m_multiBodies[i];
		{
			btMultiBodyLinkCollider* prev = body->getBaseCollider();

			for (int b=0;b<body->getNumLinks();b++)
			{
				btMultiBodyLinkCollider* cur = body->getLink(b).m_collider;
				
				if (((cur) && (!(cur)->isStaticOrKinematicObject())) &&
					((prev) && (!(prev)->isStaticOrKinematicObject())))
				{
					int tagPrev = prev->getIslandTag();
					int tagCur = cur->getIslandTag();
					getSimulationIslandManager()->getUnionFind().unite(tagPrev, tagCur);
				}
				if (cur && !cur->isStaticOrKinematicObject())
					prev = cur;
				
			}
		}
	}

	//merge islands linked by multibody constraints
	{
		for (int i=0;i<this->m_multiBodyConstraints.size();i++)
		{
			btMultiBodyConstraint* c = m_multiBodyConstraints[i];
			int tagA = c->getIslandIdA();
			int tagB = c->getIslandIdB();
			if (tagA>=0 && tagB>=0)
				getSimulationIslandManager()->getUnionFind().unite(tagA, tagB);
		}
	}

	//Store the island id in each body
	getSimulationIslandManager()->storeIslandActivationState(getCollisionWorld());

}